

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O1

int compressor_segment_mix(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined8 *puVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar18;
  float fVar19;
  uint32_t samples;
  float *output;
  float *input;
  float local_fc;
  float local_f8;
  float local_ec;
  uint32_t local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  uint local_a0;
  uint local_9c;
  int local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  float *local_68;
  float *local_60;
  undefined1 local_58 [16];
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  puVar8 = (undefined8 *)segment->data;
  local_ec = *(float *)(puVar8 + 2);
  local_7c = *(float *)((long)puVar8 + 0x14);
  fVar1 = *(float *)(puVar8 + 3);
  fVar2 = *(float *)((long)puVar8 + 0x1c);
  local_80 = *(float *)(puVar8 + 4);
  fVar3 = *(float *)((long)puVar8 + 0x24);
  fVar4 = *(float *)(puVar8 + 5);
  local_a4 = *(float *)((long)puVar8 + 0x2c);
  local_8c = *(float *)(puVar8 + 6);
  fVar5 = *(float *)((long)puVar8 + 0x34);
  local_84 = *(float *)(puVar8 + 7);
  local_58 = ZEXT416(*(uint *)((long)puVar8 + 0x3c));
  local_94 = *(float *)(puVar8 + 8);
  local_90 = *(float *)((long)puVar8 + 0x44);
  fVar6 = *(float *)(puVar8 + 9);
  local_a8 = *(float *)((long)puVar8 + 0x4c);
  iVar7 = *(int *)(puVar8 + 0xd);
  iVar13 = *(int *)((long)puVar8 + 0x6c);
  iVar12 = *(int *)(puVar8 + 0xe);
  local_ac = *(float *)(puVar8 + 10);
  local_b0 = *(float *)((long)puVar8 + 0x54);
  local_b4 = *(float *)(puVar8 + 0xb);
  fVar19 = *(float *)((long)puVar8 + 0x5c);
  local_fc = *(float *)(puVar8 + 0xc);
  local_f8 = *(float *)((long)puVar8 + 100);
  local_b8 = 0xffffffff;
  mixed_buffer_request_read(&local_60,&local_b8,(mixed_buffer *)*puVar8);
  mixed_buffer_request_write(&local_68,&local_b8,(mixed_buffer *)puVar8[1]);
  uVar9 = local_b8 & 0xffffffe0;
  if (0x1f < local_b8) {
    local_a0 = local_b8 >> 5;
    local_48 = -(float)local_58._0_4_;
    uStack_44 = local_58._4_4_ ^ 0x80000000;
    uStack_40 = local_58._8_4_ ^ 0x80000000;
    uStack_3c = local_58._12_4_ ^ 0x80000000;
    iVar11 = 0;
    uVar10 = 0;
    local_b8 = local_b8 & 0xffffffe0;
    do {
      if (0x7f7fffff < (uint)ABS(fVar19)) {
        fVar19 = 1.0;
      }
      local_9c = uVar10;
      local_88 = asinf(fVar19);
      local_88 = local_88 * 0.63661975;
      fVar16 = log10f(local_fc / local_88);
      fVar16 = fVar16 * 20.0;
      if (0.0 <= fVar16) {
        if (0x7f7fffff < (uint)ABS(fVar16)) {
          fVar16 = 1.0;
        }
        fVar17 = fVar16;
        if (fVar16 <= local_f8) {
          fVar17 = local_f8;
        }
        local_f8 = (float)(~-(uint)(local_f8 == -1.0) & (uint)fVar17 |
                          -(uint)(local_f8 == -1.0) & (uint)fVar16);
        fVar16 = 0.5;
        if (0.5 <= local_f8) {
          fVar16 = local_f8;
        }
        fVar16 = powf(0.25 / fVar16,local_a4);
        local_78 = ZEXT416((uint)(1.0 - fVar16));
      }
      else {
        if (0x7f7fffff < (uint)ABS(fVar16)) {
          fVar16 = -1.0;
        }
        fVar17 = -12.0;
        if (-12.0 <= fVar16) {
          fVar17 = fVar16;
        }
        fVar16 = (fVar17 + 12.0) * 0.25;
        local_78._0_4_ =
             powf(10.0,(5.0 / (fVar16 * local_b0 +
                               local_a8 * fVar16 * fVar16 * fVar16 + fVar16 * fVar16 * local_ac +
                              local_b4)) * 0.05);
        local_78._4_4_ = extraout_XMM0_Db;
        local_78._8_4_ = extraout_XMM0_Dc;
        local_78._12_4_ = extraout_XMM0_Dd;
        local_f8 = -1.0;
      }
      lVar14 = (long)iVar11;
      iVar15 = 0;
      local_98 = iVar11;
      do {
        fVar17 = local_60[lVar14] * local_80;
        *(float *)((long)puVar8 + (long)iVar13 * 4 + 0x74) = fVar17;
        fVar16 = -fVar17;
        if (-fVar17 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar18 = 1.0;
        fVar17 = (float)local_78._0_4_;
        if (0.0001 <= fVar16) {
          fVar18 = fVar16;
          if (fVar3 <= fVar16) {
            if (fVar2 <= 0.0) {
              fVar17 = log10f(fVar16);
              fVar18 = powf(10.0,((fVar17 * 20.0 - fVar1) * fVar4 + fVar1) * 0.05);
            }
            else {
              if (local_90 <= fVar16) {
                fVar17 = log10f(fVar16);
                fVar18 = powf(10.0,(((fVar17 * 20.0 - fVar1) - fVar2) * fVar4 + local_94) * 0.05);
              }
              else {
                fVar17 = expf((fVar16 - fVar3) * local_48);
                fVar18 = (1.0 - fVar17) / (float)local_58._0_4_ + fVar3;
              }
            }
          }
          fVar18 = fVar18 / fVar16;
          fVar17 = (float)local_78._0_4_;
        }
        fVar16 = 1.0;
        if (fVar19 < fVar18) {
          fVar17 = log10f(fVar18);
          fVar16 = -2.0;
          if (fVar17 * 20.0 <= -2.0) {
            fVar16 = fVar17 * 20.0;
          }
          fVar16 = powf(10.0,fVar16 * local_8c * -0.05);
          fVar16 = fVar16 + -1.0;
          fVar17 = (float)local_78._0_4_;
        }
        fVar19 = (fVar18 - fVar19) * fVar16 + fVar19;
        fVar16 = fVar19;
        if (0x7f7fffff < (uint)ABS(fVar19)) {
          fVar16 = 1.0;
        }
        if (1.0 <= fVar17) {
          local_fc = local_fc * fVar17;
          if (1.0 < local_fc) {
            local_fc = 1.0;
          }
        }
        else {
          local_fc = local_fc + (local_88 - local_fc) * fVar17;
        }
        fVar19 = (float)(~-(uint)(fVar19 <= 1.0) & 0x3f800000 |
                        (uint)fVar16 & -(uint)(fVar19 <= 1.0));
        fVar16 = sinf(local_fc * 1.5707964);
        fVar17 = fVar5 * fVar6 * fVar16 + local_84;
        fVar16 = log10f(fVar16);
        fVar16 = fVar16 * 20.0;
        local_ec = (float)(-(uint)(fVar16 < local_ec) & (uint)fVar16 |
                          ~-(uint)(fVar16 < local_ec) &
                          (uint)((fVar16 - local_ec) * local_7c + local_ec));
        local_68[lVar14] = fVar17 * *(float *)((long)puVar8 + (long)iVar12 * 4 + 0x74);
        lVar14 = lVar14 + 1;
        iVar12 = (iVar12 + 1) % iVar7;
        iVar13 = (iVar13 + 1) % iVar7;
        iVar15 = iVar15 + -1;
      } while (iVar15 != -0x20);
      iVar11 = local_98 + 0x20;
      uVar10 = local_9c + 1;
      uVar9 = local_b8;
    } while (uVar10 != local_a0);
  }
  local_b8 = uVar9;
  mixed_buffer_finish_write(local_b8,(mixed_buffer *)puVar8[1]);
  mixed_buffer_finish_read(local_b8,(mixed_buffer *)*puVar8);
  *(float *)(puVar8 + 2) = local_ec;
  *(float *)((long)puVar8 + 0x5c) = fVar19;
  *(float *)(puVar8 + 0xc) = local_fc;
  *(float *)((long)puVar8 + 100) = local_f8;
  *(int *)((long)puVar8 + 0x6c) = iVar13;
  *(int *)(puVar8 + 0xe) = iVar12;
  return 1;
}

Assistant:

VECTORIZE int compressor_segment_mix(struct mixed_segment *segment){
  struct compressor_segment_data *data = (struct compressor_segment_data *)segment->data;

  float metergain            = data->metergain;
  float meterrelease         = data->meterrelease;
  float threshold            = data->threshold;
  float knee                 = data->knee;
  float linearpregain        = data->linearpregain;
  float linearthreshold      = data->linearthreshold;
  float slope                = data->slope;
  float attacksamplesinv     = data->attacksamplesinv;
  float satreleasesamplesinv = data->satreleasesamplesinv;
  float wet                  = data->wet;
  float dry                  = data->dry;
  float k                    = data->k;
  float kneedboffset         = data->kneedboffset;
  float linearthresholdknee  = data->linearthresholdknee;
  float mastergain           = data->mastergain;
  float a                    = data->a;
  float b                    = data->b;
  float c                    = data->c;
  float d                    = data->d;
  float detectoravg          = data->detectoravg;
  float compgain             = data->compgain;
  float maxcompdiffdb        = data->maxcompdiffdb;
  int delaybufsize           = data->delaybufsize;
  int delaywritepos          = data->delaywritepos;
  int delayreadpos           = data->delayreadpos;
  float *delaybuf            = data->delaybuf;

  int samplesperchunk = MIXED_COMPRESSOR_SAMPLES_PER_UPDATE;
  float ang90 = (float)M_PI * 0.5f;
  float ang90inv = 2.0f / (float)M_PI;
  int samplepos = 0;
  float spacingdb = MIXED_COMPRESSOR_SPACING;

  uint32_t samples = UINT32_MAX;
  float *input, *output;
  mixed_buffer_request_read(&input, &samples, data->in);
  mixed_buffer_request_write(&output, &samples, data->out);
  
  int chunks = samples / samplesperchunk;
  samples = chunks * samplesperchunk;

  for (int ch = 0; ch < chunks; ch++){
    detectoravg = fixf(detectoravg, 1.0f);
    float desiredgain = detectoravg;
    float scaleddesiredgain = asinf(desiredgain) * ang90inv;
    float compdiffdb = lin2db(compgain / scaleddesiredgain);

    // calculate envelope rate based on whether we're attacking or releasing
    float enveloperate;
    if (compdiffdb < 0.0f){ // compgain < scaleddesiredgain, so we're releasing
      compdiffdb = fixf(compdiffdb, -1.0f);
      maxcompdiffdb = -1; // reset for a future attack mode
      // apply the adaptive release curve
      // scale compdiffdb between 0-3
      float x = (clampf(compdiffdb, -12.0f, 0.0f) + 12.0f) * 0.25f;
      float releasesamples = adaptivereleasecurve(x, a, b, c, d);
      enveloperate = db2lin(spacingdb / releasesamples);
    }
    else{ // compresorgain > scaleddesiredgain, so we're attacking
      compdiffdb = fixf(compdiffdb, 1.0f);
      if (maxcompdiffdb == -1 || maxcompdiffdb < compdiffdb)
        maxcompdiffdb = compdiffdb;
      float attenuate = maxcompdiffdb;
      if (attenuate < 0.5f)
        attenuate = 0.5f;
      enveloperate = 1.0f - powf(0.25f / attenuate, attacksamplesinv);
    }

    // process the chunk
    for (int chi = 0; chi < samplesperchunk; chi++, samplepos++,
           delayreadpos = (delayreadpos + 1) % delaybufsize,
           delaywritepos = (delaywritepos + 1) % delaybufsize){

      float inputL = input[samplepos] * linearpregain;
      delaybuf[delaywritepos] = inputL;

      inputL = absf(inputL);

      float attenuation;
      if (inputL < 0.0001f)
        attenuation = 1.0f;
      else{
        float inputcomp = compcurve(inputL, k, slope, linearthreshold, linearthresholdknee, threshold, knee, kneedboffset);
        attenuation = inputcomp / inputL;
      }

      float rate;
      if (attenuation > detectoravg){ // if releasing
        float attenuationdb = -lin2db(attenuation);
        if (attenuationdb < 2.0f)
          attenuationdb = 2.0f;
        float dbpersample = attenuationdb * satreleasesamplesinv;
        rate = db2lin(dbpersample) - 1.0f;
      }
      else
        rate = 1.0f;

      detectoravg += (attenuation - detectoravg) * rate;
      if (detectoravg > 1.0f)
        detectoravg = 1.0f;
      detectoravg = fixf(detectoravg, 1.0f);

      if (enveloperate < 1) // attack, reduce gain
        compgain += (scaleddesiredgain - compgain) * enveloperate;
      else{ // release, increase gain
        compgain *= enveloperate;
        if (compgain > 1.0f)
          compgain = 1.0f;
      }

      // the final gain value!
      float premixgain = sinf(ang90 * compgain);
      float gain = dry + wet * mastergain * premixgain;

      // calculate metering (not used in core algo, but used to output a meter if desired)
      float premixgaindb = lin2db(premixgain);
      if (premixgaindb < metergain)
        metergain = premixgaindb; // spike immediately
      else
        metergain += (premixgaindb - metergain) * meterrelease; // fall slowly

      // apply the gain
      output[samplepos] = delaybuf[delayreadpos] * gain;
    }
  }

  mixed_buffer_finish_write(samples, data->out);
  mixed_buffer_finish_read(samples, data->in);

  data->metergain     = metergain;
  data->detectoravg   = detectoravg;
  data->compgain      = compgain;
  data->maxcompdiffdb = maxcompdiffdb;
  data->delaywritepos = delaywritepos;
  data->delayreadpos  = delayreadpos;
  
  return 1;
}